

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderPackedFieldParsingCase
          (MessageBuilderGenerator *this,Printer *printer,FieldDescriptor *field)

{
  Nonnull<char_*> pcVar1;
  ImmutableFieldGenerator *pIVar2;
  string_view text;
  string_view text_00;
  string tagString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(field->number_ * 8 + 2,local_50);
  local_60 = (long)pcVar1 - (long)local_50;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_58 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,local_50,pcVar1);
  text._M_str = "case $tag$: {\n";
  text._M_len = 0xe;
  io::Printer::Print<char[4],std::__cxx11::string>(printer,text,(char (*) [4])0x1370a5c,&local_80);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  pIVar2 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                     (&this->field_generators_,field);
  (*(pIVar2->super_FieldGenerator)._vptr_FieldGenerator[0x11])(pIVar2,printer);
  io::Printer::Outdent(printer);
  text_00._M_str = "  break;\n} // case $tag$\n";
  text_00._M_len = 0x19;
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,text_00,(char (*) [4])0x1370a5c,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderPackedFieldParsingCase(
    io::Printer* printer, const FieldDescriptor* field) {
  // To make packed = true wire compatible, we generate parsing code from a
  // packed version of this field regardless of field->options().packed().
  uint32_t tag = WireFormatLite::MakeTag(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
  std::string tagString = absl::StrCat(static_cast<int32_t>(tag));
  printer->Print("case $tag$: {\n", "tag", tagString);
  printer->Indent();

  field_generators_.get(field).GenerateBuilderParsingCodeFromPacked(printer);

  printer->Outdent();
  printer->Print(
      "  break;\n"
      "} // case $tag$\n",
      "tag", tagString);
}